

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O1

int SUNLinSolSetup_PCG(SUNLinearSolver S,SUNMatrix nul)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  
  pcVar1 = *(code **)((long)S->content + 0x30);
  iVar3 = 0;
  if (pcVar1 != (code *)0x0) {
    iVar2 = (*pcVar1)(*(undefined8 *)((long)S->content + 0x40));
    iVar3 = 0;
    if ((iVar2 != 0) && (iVar3 = 0x324, iVar2 < 0)) {
      iVar3 = -0x326;
    }
  }
  *(int *)((long)S->content + 0x18) = iVar3;
  return iVar3;
}

Assistant:

int SUNLinSolSetup_PCG(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix nul)
{
  SUNFunctionBegin(S->sunctx);

  int status;
  SUNPSetupFn Psetup;
  void* PData;

  /* Set shortcuts to PCG memory structures */
  Psetup = PCG_CONTENT(S)->Psetup;
  PData  = PCG_CONTENT(S)->PData;

  /* no solver-specific setup is required, but if user-supplied
     Psetup routine exists, call that here */
  if (Psetup != NULL)
  {
    status = Psetup(PData);
    if (status != 0)
    {
      LASTFLAG(S) = (status < 0) ? SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return (LASTFLAG(S));
    }
  }

  /* return with success */
  LASTFLAG(S) = SUN_SUCCESS;
  return SUN_SUCCESS;
}